

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSeparateShaderTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_0::Pipeline::Pipeline
          (Pipeline *this,
          MovePtr<glu::ProgramPipeline,_de::DefaultDeleter<glu::ProgramPipeline>_> *pipeline_,
          MovePtr<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
          *fullProg_,
          MovePtr<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
          *vtxProg_,
          MovePtr<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
          *frgProg_)

{
  PtrData<glu::ProgramPipeline,_de::DefaultDeleter<glu::ProgramPipeline>_> data;
  PtrData<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
  data_00;
  PtrData<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
  data_01;
  PtrData<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
  data_02;
  MovePtr *pMVar1;
  ProgramPipeline *in_stack_ffffffffffffff18;
  undefined8 in_stack_ffffffffffffff20;
  UniquePtr<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
  *this_00;
  MovePtr<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
  *frgProg__local;
  MovePtr<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
  *vtxProg__local;
  MovePtr<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
  *fullProg__local;
  MovePtr<glu::ProgramPipeline,_de::DefaultDeleter<glu::ProgramPipeline>_> *pipeline__local;
  Pipeline *this_local;
  
  pMVar1 = (MovePtr *)
           de::details::MovePtr::operator_cast_to_PtrData
                     ((PtrData<glu::ProgramPipeline,_de::DefaultDeleter<glu::ProgramPipeline>_> *)
                      pipeline_,(MovePtr *)pipeline_);
  data._8_8_ = in_stack_ffffffffffffff20;
  data.ptr = in_stack_ffffffffffffff18;
  de::details::UniquePtr<glu::ProgramPipeline,_de::DefaultDeleter<glu::ProgramPipeline>_>::UniquePtr
            (&this->pipeline,data);
  pMVar1 = (MovePtr *)
           de::details::MovePtr::operator_cast_to_PtrData
                     ((PtrData<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
                       *)fullProg_,pMVar1);
  data_00._8_8_ = in_stack_ffffffffffffff20;
  data_00.ptr = (ProgramWrapper *)in_stack_ffffffffffffff18;
  de::details::
  UniquePtr<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
  ::UniquePtr(&this->fullProg,data_00);
  pMVar1 = (MovePtr *)
           de::details::MovePtr::operator_cast_to_PtrData
                     ((PtrData<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
                       *)vtxProg_,pMVar1);
  data_01._8_8_ = in_stack_ffffffffffffff20;
  data_01.ptr = (ProgramWrapper *)in_stack_ffffffffffffff18;
  de::details::
  UniquePtr<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
  ::UniquePtr(&this->vtxProg,data_01);
  this_00 = &this->frgProg;
  de::details::MovePtr::operator_cast_to_PtrData
            ((PtrData<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
              *)frgProg_,pMVar1);
  data_02._8_8_ = this_00;
  data_02.ptr = (ProgramWrapper *)in_stack_ffffffffffffff18;
  de::details::
  UniquePtr<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
  ::UniquePtr(this_00,data_02);
  return;
}

Assistant:

Pipeline			(MovePtr<ProgramPipeline>	pipeline_,
													 MovePtr<ProgramWrapper>	fullProg_,
													 MovePtr<ProgramWrapper>	vtxProg_,
													 MovePtr<ProgramWrapper>	frgProg_)
									: pipeline	(pipeline_)
									, fullProg	(fullProg_)
									, vtxProg	(vtxProg_)
									, frgProg	(frgProg_) {}